

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

QJsonObject __thiscall QPluginParsedMetaData::toJson(QPluginParsedMetaData *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  qint64 qVar5;
  long lVar6;
  QCborContainerPrivate *pQVar7;
  long in_FS_OFFSET;
  QCborValueConstRef QVar8;
  iterator iVar9;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QCborValueConstRef local_80;
  QCborValueConstRef local_70;
  QCborMap local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->data).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  QCborValue::toMap((QCborValue *)&local_60);
  QVar8 = (QCborValueConstRef)QCborMap::begin(&local_60);
  iVar9 = QCborMap::end(&local_60);
  lVar6 = iVar9.item.super_QCborValueConstRef.i - QVar8.i;
  do {
    pQVar7 = QVar8.d;
    if ((pQVar7 == iVar9.item.super_QCborValueConstRef.d) && (lVar6 == 0)) {
      QCborMap::~QCborMap(&local_60);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
             (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
    }
    local_80.i = QVar8.i + -1;
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    local_80.d = pQVar7;
    local_70 = QVar8;
    bVar4 = QCborValueConstRef::isInteger(&local_80);
    if (!bVar4) {
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (char16_t *)0x0;
      local_b8.size = 0;
      QCborValueConstRef::toString((QString *)&local_58,&local_80,(QString *)&local_b8);
      qVar3 = local_98.size;
      pcVar2 = local_98.ptr;
      pDVar1 = local_98.d;
      local_98.d = local_58.d;
      local_98.ptr = local_58.ptr;
      local_58.d = pDVar1;
      local_58.ptr = pcVar2;
      local_98.size = local_58.size;
      local_58.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      goto switchD_002a819b_default;
    }
    qVar5 = QCborValueConstRef::toInteger(&local_80,0);
    qVar3 = local_98.size;
    pcVar2 = local_98.ptr;
    switch(qVar5) {
    case 0:
      local_98.ptr = L"version";
      local_98.size = 7;
      break;
    case 1:
      local_98.ptr = L"archlevel";
      goto LAB_002a82fc;
    case 2:
      local_98.ptr = L"IID";
      goto LAB_002a8336;
    case 3:
      local_98.ptr = L"className";
LAB_002a82fc:
      local_98.size = 9;
      break;
    case 4:
      local_98.ptr = L"MetaData";
      local_98.size = 8;
      break;
    case 5:
      local_98.ptr = L"URI";
LAB_002a8336:
      local_98.size = 3;
      break;
    case 6:
      local_98.ptr = L"debug";
      local_98.size = 5;
      break;
    default:
      goto switchD_002a819b_default;
    }
    local_58.ptr = pcVar2;
    local_58.d = local_98.d;
    local_98.d = (Data *)0x0;
    local_b8.size = 0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.d = (Data *)0x0;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
switchD_002a819b_default:
    if (local_98.size != 0) {
      QCborValueRef::toJsonValue((QJsonValue *)&local_58,(QCborValueRef *)&local_70);
      QJsonObject::insert((QJsonObject *)this,(QString *)&local_98,(QJsonValue *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QVar8.i = QVar8.i + 2;
    QVar8.d = pQVar7;
    lVar6 = lVar6 + -2;
  } while( true );
}

Assistant:

QJsonObject QPluginParsedMetaData::toJson() const
{
    // convert from the internal CBOR representation to an external JSON one
    QJsonObject o;
    for (auto it : data.toMap()) {
        QString key;
        if (it.first.isInteger()) {
            switch (it.first.toInteger()) {
#define CONVERT_TO_STRING(IntKey, StringKey, Description) \
            case int(IntKey): key = QStringLiteral(StringKey); break;
                QT_PLUGIN_FOREACH_METADATA(CONVERT_TO_STRING)
            }
        } else {
            key = it.first.toString();
        }

        if (!key.isEmpty())
            o.insert(key, it.second.toJsonValue());
    }
    return o;
}